

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucketaccum.hpp
# Opt level: O0

void __thiscall
mp::BucketAccum1Type<mp::QuadTerms>::~BucketAccum1Type(BucketAccum1Type<mp::QuadTerms> *this)

{
  array<mp::QuadTerms,_64UL> *in_stack_00000010;
  
  std::array<mp::QuadTerms,_64UL>::~array(in_stack_00000010);
  return;
}

Assistant:

BucketAccum1Type<Body>::~BucketAccum1Type() {
#ifndef NDEBUG
  for (const auto& b: buckets_)
    assert(b.empty());
#endif
}